

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

QVariant * qDateFromString(QVariant *__return_storage_ptr__,QString *val)

{
  QDate QVar1;
  QVariant *pQVar2;
  long in_RDX;
  QStringView QVar3;
  
  if (in_RDX == 0) {
    QVar1.jd = -0x8000000000000000;
  }
  else {
    QVar3.m_data = (storage_type_conflict *)val;
    QVar3.m_size = in_RDX;
    QVar1.jd = QDate::fromString(QVar3,ISODate);
  }
  pQVar2 = (QVariant *)QVariant::QVariant(__return_storage_ptr__,QVar1);
  return pQVar2;
}

Assistant:

static inline QVariant qDateFromString(const QString &val)
{
#if !QT_CONFIG(datestring)
    Q_UNUSED(val);
    return QVariant(val);
#else
    if (val.isEmpty())
        return QVariant(QDate());
    return QVariant(QDate::fromString(val, Qt::ISODate));
#endif
}